

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O3

int Emb_ManComputeDistance_old(Emb_Man_t *p,Emb_Obj_t *pPivot)

{
  int *piVar1;
  uint *puVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  Vec_Int_t *pVVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  Vec_Int_t *local_48;
  
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 1000;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(4000);
  pVVar4->pArray = piVar5;
  local_48 = (Vec_Int_t *)malloc(0x10);
  local_48->nCap = 1000;
  local_48->nSize = 0;
  piVar5 = (int *)malloc(4000);
  local_48->pArray = piVar5;
  uVar3 = p->nTravIds + 1;
  p->nTravIds = uVar3;
  (pPivot->field_7).TravId = uVar3;
  Vec_IntPush(pVVar4,pPivot->hHandle);
  if (pVVar4->nSize < 1) {
    iVar9 = 0;
  }
  else {
    iVar9 = 0;
    piVar5 = &pVVar4->nSize;
    do {
      pVVar6 = pVVar4;
      local_48->nSize = 0;
      pVVar4 = local_48;
      if (pVVar6->nSize < 1) {
        iVar9 = iVar9 + 1;
        local_48 = pVVar6;
        break;
      }
      piVar1 = &local_48->nSize;
      lVar11 = 0;
      do {
        if (p->pObjData == (int *)0x0) break;
        puVar2 = (uint *)(p->pObjData + (uint)pVVar6->pArray[lVar11]);
        uVar3 = *puVar2;
        if (0xf < uVar3) {
          uVar10 = 0;
          do {
            lVar7 = (long)(int)puVar2[uVar10 + 5];
            if (puVar2[3 - lVar7] != p->nTravIds) {
              puVar2[3 - lVar7] = p->nTravIds;
              Vec_IntPush(local_48,puVar2[2 - lVar7]);
              uVar3 = *puVar2;
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 < uVar3 >> 4);
        }
        uVar3 = puVar2[1];
        if (0 < (int)uVar3) {
          lVar7 = 0;
          do {
            lVar8 = (long)(int)puVar2[(ulong)(*puVar2 >> 4) + lVar7 + 5];
            if (puVar2[lVar8 + 3] != p->nTravIds) {
              puVar2[lVar8 + 3] = p->nTravIds;
              Vec_IntPush(local_48,puVar2[lVar8 + 2]);
              uVar3 = puVar2[1];
            }
            lVar7 = lVar7 + 1;
          } while ((int)lVar7 < (int)uVar3);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < *piVar5);
      iVar9 = iVar9 + 1;
      piVar5 = piVar1;
      local_48 = pVVar6;
    } while (0 < *piVar1);
  }
  if (pVVar4->pArray != (int *)0x0) {
    free(pVVar4->pArray);
  }
  free(pVVar4);
  if (local_48->pArray != (int *)0x0) {
    free(local_48->pArray);
  }
  free(local_48);
  return iVar9;
}

Assistant:

int Emb_ManComputeDistance_old( Emb_Man_t * p, Emb_Obj_t * pPivot )
{
    Vec_Int_t * vThis, * vNext, * vTemp;
    Emb_Obj_t * pThis, * pNext;
    int i, k, d, nVisited = 0;
//    assert( Emb_ObjIsTerm(pPivot) );
    vThis = Vec_IntAlloc( 1000 );
    vNext = Vec_IntAlloc( 1000 );
    Emb_ManIncrementTravId( p );
    Emb_ObjSetTravIdCurrent( p, pPivot );
    Vec_IntPush( vThis, pPivot->hHandle );
    for ( d = 0; Vec_IntSize(vThis) > 0; d++ )
    {
        nVisited += Vec_IntSize(vThis);
        Vec_IntClear( vNext );
        Emb_ManForEachObjVec( vThis, p, pThis, i )
        {
            Emb_ObjForEachFanin( pThis, pNext, k )
            {
                if ( Emb_ObjIsTravIdCurrent(p, pNext) )
                    continue;
                Emb_ObjSetTravIdCurrent(p, pNext);
                Vec_IntPush( vNext, pNext->hHandle );
                nVisited += !Emb_ObjIsTerm(pNext);
            }
            Emb_ObjForEachFanout( pThis, pNext, k )
            {
                if ( Emb_ObjIsTravIdCurrent(p, pNext) )
                    continue;
                Emb_ObjSetTravIdCurrent(p, pNext);
                Vec_IntPush( vNext, pNext->hHandle );
                nVisited += !Emb_ObjIsTerm(pNext);
            }
        }
        vTemp = vThis; vThis = vNext; vNext = vTemp;
    }
    Vec_IntFree( vThis );
    Vec_IntFree( vNext );
    // check if there are several strongly connected components
//    if ( nVisited < Emb_ManNodeNum(p) )
//        printf( "Visited less nodes (%d) than present (%d).\n", nVisited, Emb_ManNodeNum(p) );
    return d;
}